

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

DETACH_HANDLE detach_clone(DETACH_HANDLE value)

{
  AMQP_VALUE pAVar1;
  DETACH_HANDLE local_18;
  DETACH_INSTANCE *detach_instance;
  DETACH_HANDLE value_local;
  
  local_18 = (DETACH_HANDLE)malloc(8);
  if (local_18 != (DETACH_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (DETACH_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

DETACH_HANDLE detach_clone(DETACH_HANDLE value)
{
    DETACH_INSTANCE* detach_instance = (DETACH_INSTANCE*)malloc(sizeof(DETACH_INSTANCE));
    if (detach_instance != NULL)
    {
        detach_instance->composite_value = amqpvalue_clone(((DETACH_INSTANCE*)value)->composite_value);
        if (detach_instance->composite_value == NULL)
        {
            free(detach_instance);
            detach_instance = NULL;
        }
    }

    return detach_instance;
}